

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::OnAtomicRmwCmpxchgExpr(Validator *this,AtomicRmwCmpxchgExpr *expr)

{
  AtomicRmwCmpxchgExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = (Location *)&expr->field_0x18;
  (anonymous_namespace)::Validator::CheckAtomicExpr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
            ((Validator *)this,expr,0x16c62b0);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnAtomicRmwCmpxchgExpr(AtomicRmwCmpxchgExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckAtomicExpr(expr, &TypeChecker::OnAtomicRmwCmpxchg);
  return Result::Ok;
}